

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
webfront::log::debug<int,_int,_int,_int,_unsigned_long,_unsigned_long>::debug
          (debug<int,_int,_int,_int,_unsigned_long,_unsigned_long> *this,string_view fmt,int *ts,
          int *ts_1,int *ts_2,int *ts_3,unsigned_long *ts_4,unsigned_long *ts_5,srcLoc *l)

{
  string_view fmt_00;
  bool bVar1;
  int *in_stack_00000008;
  int *in_stack_00000010;
  srcLoc *in_stack_00000018;
  LogType in_stack_00000027;
  size_t in_stack_00000028;
  
  bVar1 = anon_unknown_4::is('\x04');
  if (bVar1) {
    fmt_00._M_str = (char *)ts_2;
    fmt_00._M_len = in_stack_00000028;
    (anonymous_namespace)::log<int,int,int,int,unsigned_long,unsigned_long>
              (in_stack_00000027,fmt_00,in_stack_00000018,in_stack_00000010,in_stack_00000008,ts,
               (int *)this,(unsigned_long *)fmt._M_len,(unsigned_long *)fmt._M_str);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }